

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jddctmgr.c
# Opt level: O3

void start_pass(j_decompress_ptr cinfo)

{
  double dVar1;
  int iVar2;
  J_DCT_METHOD JVar3;
  jpeg_inverse_dct *pjVar4;
  JQUANT_TBL *pJVar5;
  void *pvVar6;
  jpeg_error_mgr *pjVar7;
  int iVar8;
  int iVar9;
  inverse_DCT_method_ptr p_Var10;
  code *pcVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  jpeg_component_info *pjVar18;
  
  if (0 < cinfo->num_components) {
    pjVar18 = cinfo->comp_info;
    pjVar4 = cinfo->idct;
    lVar17 = 0;
    iVar9 = 0;
    p_Var10 = (inverse_DCT_method_ptr)0x0;
    do {
      iVar2 = pjVar18->DCT_scaled_size;
      pcVar11 = jpeg_idct_1x1;
      iVar8 = 0;
      switch(iVar2) {
      case 1:
        goto switchD_0014321b_caseD_1;
      case 2:
        iVar9 = jsimd_can_idct_2x2();
        pcVar11 = jsimd_idct_2x2;
        if (iVar9 == 0) {
          pcVar11 = jpeg_idct_2x2;
        }
        goto LAB_001432a1;
      case 3:
        pcVar11 = jpeg_idct_3x3;
        break;
      case 4:
        iVar9 = jsimd_can_idct_4x4();
        pcVar11 = jsimd_idct_4x4;
        if (iVar9 == 0) {
          pcVar11 = jpeg_idct_4x4;
        }
LAB_001432a1:
        iVar8 = 0;
        goto switchD_0014321b_caseD_1;
      case 5:
        pcVar11 = jpeg_idct_5x5;
        break;
      case 6:
        pcVar11 = jpeg_idct_6x6;
        break;
      case 7:
        pcVar11 = jpeg_idct_7x7;
        break;
      case 8:
        JVar3 = cinfo->dct_method;
        if (JVar3 == JDCT_FLOAT) {
          iVar9 = jsimd_can_idct_float();
          pcVar11 = jsimd_idct_float;
          if (iVar9 == 0) {
            pcVar11 = jpeg_idct_float;
          }
          iVar8 = 2;
        }
        else if (JVar3 == JDCT_IFAST) {
          iVar9 = jsimd_can_idct_ifast();
          pcVar11 = jsimd_idct_ifast;
          if (iVar9 == 0) {
            pcVar11 = jpeg_idct_ifast;
          }
          iVar8 = 1;
        }
        else {
          if (JVar3 == JDCT_ISLOW) {
            iVar9 = jsimd_can_idct_islow();
            pcVar11 = jsimd_idct_islow;
            if (iVar9 == 0) {
              pcVar11 = jpeg_idct_islow;
            }
            goto LAB_001432a1;
          }
          pjVar7 = cinfo->err;
          pjVar7->msg_code = 0x30;
          (*pjVar7->error_exit)((j_common_ptr)cinfo);
          pcVar11 = p_Var10;
          iVar8 = iVar9;
        }
        goto switchD_0014321b_caseD_1;
      case 9:
        pcVar11 = jpeg_idct_9x9;
        break;
      case 10:
        pcVar11 = jpeg_idct_10x10;
        break;
      case 0xb:
        pcVar11 = jpeg_idct_11x11;
        break;
      case 0xc:
        pcVar11 = jpeg_idct_12x12;
        break;
      case 0xd:
        pcVar11 = jpeg_idct_13x13;
        break;
      case 0xe:
        pcVar11 = jpeg_idct_14x14;
        break;
      case 0xf:
        pcVar11 = jpeg_idct_15x15;
        break;
      case 0x10:
        pcVar11 = jpeg_idct_16x16;
        break;
      default:
        pjVar7 = cinfo->err;
        pjVar7->msg_code = 7;
        (pjVar7->msg_parm).i[0] = iVar2;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        pcVar11 = p_Var10;
        iVar8 = iVar9;
        goto switchD_0014321b_caseD_1;
      }
      iVar8 = 0;
switchD_0014321b_caseD_1:
      iVar9 = iVar8;
      pjVar4->inverse_DCT[lVar17] = pcVar11;
      if (((pjVar18->component_needed != 0) &&
          (*(int *)((long)pjVar4[1].inverse_DCT + lVar17 * 4 + -8) != iVar9)) &&
         (pJVar5 = pjVar18->quant_table, pJVar5 != (JQUANT_TBL *)0x0)) {
        *(int *)((long)pjVar4[1].inverse_DCT + lVar17 * 4 + -8) = iVar9;
        pvVar6 = pjVar18->dct_table;
        lVar13 = 0;
        if (iVar9 == 0) {
          do {
            *(UINT16 *)((long)pvVar6 + lVar13 * 2) = pJVar5->quantval[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x40);
        }
        else if (iVar9 == 1) {
          do {
            *(short *)((long)pvVar6 + lVar13) =
                 (short)((int)*(short *)((long)start_pass::aanscales + lVar13) *
                         (uint)*(ushort *)((long)pJVar5->quantval + lVar13) + 0x800 >> 0xc);
            lVar13 = lVar13 + 2;
          } while (lVar13 != 0x80);
        }
        else {
          lVar14 = 0;
          do {
            lVar15 = (long)(int)lVar14;
            lVar14 = lVar15 + 8;
            dVar1 = start_pass::aanscalefactor[lVar13];
            pdVar16 = start_pass::aanscalefactor;
            lVar12 = 0;
            do {
              *(ulong *)((long)pvVar6 + lVar12 * 4 + lVar15 * 4) =
                   CONCAT44((float)((double)(*(uint *)(pJVar5->quantval + lVar15 + lVar12) >> 0x10)
                                    * dVar1 * pdVar16[1]),
                            (float)((double)(*(uint *)(pJVar5->quantval + lVar15 + lVar12) & 0xffff)
                                    * dVar1 * *pdVar16));
              lVar12 = lVar12 + 2;
              pdVar16 = pdVar16 + 2;
            } while (lVar12 != 8);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 8);
        }
      }
      lVar17 = lVar17 + 1;
      pjVar18 = pjVar18 + 1;
      p_Var10 = pcVar11;
    } while (lVar17 < cinfo->num_components);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass(j_decompress_ptr cinfo)
{
  my_idct_ptr idct = (my_idct_ptr)cinfo->idct;
  int ci, i;
  jpeg_component_info *compptr;
  int method = 0;
  inverse_DCT_method_ptr method_ptr = NULL;
  JQUANT_TBL *qtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Select the proper IDCT routine for this component's scaling */
    switch (compptr->_DCT_scaled_size) {
#ifdef IDCT_SCALING_SUPPORTED
    case 1:
      method_ptr = jpeg_idct_1x1;
      method = JDCT_ISLOW;      /* jidctred uses islow-style table */
      break;
    case 2:
      if (jsimd_can_idct_2x2())
        method_ptr = jsimd_idct_2x2;
      else
        method_ptr = jpeg_idct_2x2;
      method = JDCT_ISLOW;      /* jidctred uses islow-style table */
      break;
    case 3:
      method_ptr = jpeg_idct_3x3;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 4:
      if (jsimd_can_idct_4x4())
        method_ptr = jsimd_idct_4x4;
      else
        method_ptr = jpeg_idct_4x4;
      method = JDCT_ISLOW;      /* jidctred uses islow-style table */
      break;
    case 5:
      method_ptr = jpeg_idct_5x5;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 6:
#if defined(__mips__)
      if (jsimd_can_idct_6x6())
        method_ptr = jsimd_idct_6x6;
      else
#endif
      method_ptr = jpeg_idct_6x6;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 7:
      method_ptr = jpeg_idct_7x7;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
#endif
    case DCTSIZE:
      switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
      case JDCT_ISLOW:
        if (jsimd_can_idct_islow())
          method_ptr = jsimd_idct_islow;
        else
          method_ptr = jpeg_idct_islow;
        method = JDCT_ISLOW;
        break;
#endif
#ifdef DCT_IFAST_SUPPORTED
      case JDCT_IFAST:
        if (jsimd_can_idct_ifast())
          method_ptr = jsimd_idct_ifast;
        else
          method_ptr = jpeg_idct_ifast;
        method = JDCT_IFAST;
        break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
      case JDCT_FLOAT:
        if (jsimd_can_idct_float())
          method_ptr = jsimd_idct_float;
        else
          method_ptr = jpeg_idct_float;
        method = JDCT_FLOAT;
        break;
#endif
      default:
        ERREXIT(cinfo, JERR_NOT_COMPILED);
        break;
      }
      break;
#ifdef IDCT_SCALING_SUPPORTED
    case 9:
      method_ptr = jpeg_idct_9x9;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 10:
      method_ptr = jpeg_idct_10x10;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 11:
      method_ptr = jpeg_idct_11x11;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 12:
#if defined(__mips__)
      if (jsimd_can_idct_12x12())
        method_ptr = jsimd_idct_12x12;
      else
#endif
      method_ptr = jpeg_idct_12x12;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 13:
      method_ptr = jpeg_idct_13x13;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 14:
      method_ptr = jpeg_idct_14x14;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 15:
      method_ptr = jpeg_idct_15x15;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 16:
      method_ptr = jpeg_idct_16x16;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
#endif
    default:
      ERREXIT1(cinfo, JERR_BAD_DCTSIZE, compptr->_DCT_scaled_size);
      break;
    }
    idct->pub.inverse_DCT[ci] = method_ptr;
    /* Create multiplier table from quant table.
     * However, we can skip this if the component is uninteresting
     * or if we already built the table.  Also, if no quant table
     * has yet been saved for the component, we leave the
     * multiplier table all-zero; we'll be reading zeroes from the
     * coefficient controller's buffer anyway.
     */
    if (!compptr->component_needed || idct->cur_method[ci] == method)
      continue;
    qtbl = compptr->quant_table;
    if (qtbl == NULL)           /* happens if no data yet for component */
      continue;
    idct->cur_method[ci] = method;
    switch (method) {
#ifdef PROVIDE_ISLOW_TABLES
    case JDCT_ISLOW:
      {
        /* For LL&M IDCT method, multipliers are equal to raw quantization
         * coefficients, but are stored as ints to ensure access efficiency.
         */
        ISLOW_MULT_TYPE *ismtbl = (ISLOW_MULT_TYPE *)compptr->dct_table;
        for (i = 0; i < DCTSIZE2; i++) {
          ismtbl[i] = (ISLOW_MULT_TYPE)qtbl->quantval[i];
        }
      }
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
        /* For AA&N IDCT method, multipliers are equal to quantization
         * coefficients scaled by scalefactor[row]*scalefactor[col], where
         *   scalefactor[0] = 1
         *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
         * For integer operation, the multiplier table is to be scaled by
         * IFAST_SCALE_BITS.
         */
        IFAST_MULT_TYPE *ifmtbl = (IFAST_MULT_TYPE *)compptr->dct_table;
#define CONST_BITS  14
        static const INT16 aanscales[DCTSIZE2] = {
          /* precomputed values scaled up by 14 bits */
          16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
          22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
          21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
          19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
          16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
          12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
           8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
           4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
        };
        SHIFT_TEMPS

        for (i = 0; i < DCTSIZE2; i++) {
          ifmtbl[i] = (IFAST_MULT_TYPE)
            DESCALE(MULTIPLY16V16((JLONG)qtbl->quantval[i],
                                  (JLONG)aanscales[i]),
                    CONST_BITS - IFAST_SCALE_BITS);
        }
      }
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
        /* For float AA&N IDCT method, multipliers are equal to quantization
         * coefficients scaled by scalefactor[row]*scalefactor[col], where
         *   scalefactor[0] = 1
         *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
         */
        FLOAT_MULT_TYPE *fmtbl = (FLOAT_MULT_TYPE *)compptr->dct_table;
        int row, col;
        static const double aanscalefactor[DCTSIZE] = {
          1.0, 1.387039845, 1.306562965, 1.175875602,
          1.0, 0.785694958, 0.541196100, 0.275899379
        };

        i = 0;
        for (row = 0; row < DCTSIZE; row++) {
          for (col = 0; col < DCTSIZE; col++) {
            fmtbl[i] = (FLOAT_MULT_TYPE)
              ((double)qtbl->quantval[i] *
               aanscalefactor[row] * aanscalefactor[col]);
            i++;
          }
        }
      }
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}